

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities.cpp
# Opt level: O0

double Js::NumberUtilities::DblFromBinary<unsigned_char>
                 (uchar *psz,uchar **ppchLim,bool isNumericSeparatorEnabled)

{
  uint32 uVar1;
  code *pcVar2;
  char cVar3;
  uchar **ppuVar4;
  bool bVar5;
  uint uVar6;
  uint32 *puVar7;
  undefined4 *puVar8;
  uint leftShiftValue;
  uint rightShiftValue;
  uchar *pszSave;
  byte local_35;
  int cbit;
  byte bExtra;
  double dStack_30;
  uint uT;
  double dbl;
  uchar **ppuStack_20;
  bool isNumericSeparatorEnabled_local;
  uchar **ppchLim_local;
  uchar *psz_local;
  
  dStack_30 = 0.0;
  dbl._7_1_ = isNumericSeparatorEnabled;
  ppuStack_20 = ppchLim;
  ppchLim_local = (uchar **)psz;
  puVar7 = LuHiDbl(&stack0xffffffffffffffd0);
  if (*puVar7 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/NumberUtilities.cpp"
                                ,0x219,"(Js::NumberUtilities::LuHiDbl(dbl) == 0)",
                                "Js::NumberUtilities::LuHiDbl(dbl) == 0");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  puVar7 = LuLoDbl(&stack0xffffffffffffffd0);
  if (*puVar7 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/NumberUtilities.cpp"
                                ,0x21a,"(Js::NumberUtilities::LuLoDbl(dbl) == 0)",
                                "Js::NumberUtilities::LuLoDbl(dbl) == 0");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  ppuVar4 = ppchLim_local;
  local_35 = 0;
  while( true ) {
    for (; *(char *)ppchLim_local == '0'; ppchLim_local = (uchar **)((long)ppchLim_local + 1)) {
    }
    if (*(byte *)ppchLim_local - 0x30 < 2) break;
    if ((((*(char *)ppchLim_local != '_') || ((dbl._7_1_ & 1) == 0)) || (ppchLim_local <= ppuVar4))
       || ((*(char *)((long)ppchLim_local + -1) != '0' ||
           (1 < *(byte *)((long)ppchLim_local + 1) - 0x30)))) {
      *ppuStack_20 = (uchar *)ppchLim_local;
      return dStack_30;
    }
    ppchLim_local = (uchar **)((long)ppchLim_local + 1);
  }
  pszSave._4_4_ = 1;
  ppchLim_local = (uchar **)((long)ppchLim_local + 1);
  while( true ) {
    for (; uVar6 = *(byte *)ppchLim_local - 0x30, uVar6 < 2;
        ppchLim_local = (uchar **)((long)ppchLim_local + 1)) {
      cVar3 = (char)pszSave._4_4_;
      if (pszSave._4_4_ < 0x15) {
        puVar7 = LuHiDbl(&stack0xffffffffffffffd0);
        *puVar7 = uVar6 << (0x14U - cVar3 & 0x1f) | *puVar7;
      }
      else if (pszSave._4_4_ < 0x35) {
        puVar7 = LuLoDbl(&stack0xffffffffffffffd0);
        *puVar7 = uVar6 << (0x34U - cVar3 & 0x1f) | *puVar7;
      }
      else if (pszSave._4_4_ == 0x35) {
        puVar7 = LuLoDbl(&stack0xffffffffffffffd0);
        *puVar7 = uVar6 >> (cVar3 - 0x34U & 0x1f) | *puVar7;
        local_35 = (byte)(uVar6 << (0x3cU - cVar3 & 0x1f));
      }
      else if (uVar6 != 0) {
        local_35 = local_35 | 1;
      }
      pszSave._4_4_ = pszSave._4_4_ + 1;
    }
    if ((((*(char *)ppchLim_local != '_') || ((dbl._7_1_ & 1) == 0)) || ((int)pszSave._4_4_ < 1)) ||
       ((*(char *)((long)ppchLim_local + -1) == '_' ||
        (1 < *(byte *)((long)ppchLim_local + 1) - 0x30)))) break;
    ppchLim_local = (uchar **)((long)ppchLim_local + 1);
  }
  *ppuStack_20 = (uchar *)ppchLim_local;
  if ((int)(pszSave._4_4_ + 0x3fe) < 0x7ff) {
    puVar7 = LuHiDbl(&stack0xffffffffffffffd0);
    *puVar7 = (pszSave._4_4_ + 0x3fe) * 0x100000 | *puVar7;
    if (((local_35 & 0x80) != 0) &&
       (((local_35 & 0x7f) != 0 || (puVar7 = LuLoDbl(&stack0xffffffffffffffd0), (*puVar7 & 1) != 0))
       )) {
      puVar7 = LuLoDbl(&stack0xffffffffffffffd0);
      uVar1 = *puVar7;
      *puVar7 = uVar1 + 1;
      if (uVar1 + 1 == 0) {
        puVar7 = LuHiDbl(&stack0xffffffffffffffd0);
        *puVar7 = *puVar7 + 1;
      }
    }
    return dStack_30;
  }
  puVar7 = LuHiDbl(&stack0xffffffffffffffd0);
  *puVar7 = 0x7ff00000;
  puVar7 = LuLoDbl(&stack0xffffffffffffffd0);
  *puVar7 = 0;
  return dStack_30;
}

Assistant:

double NumberUtilities::DblFromBinary(const EncodedChar *psz, const EncodedChar **ppchLim, bool isNumericSeparatorEnabled)
    {
        double dbl = 0;
        Assert(Js::NumberUtilities::LuHiDbl(dbl) == 0);
        Assert(Js::NumberUtilities::LuLoDbl(dbl) == 0);
        uint uT;
        byte bExtra = 0;
        int cbit = 0;
        const EncodedChar* pszSave = psz;

        // Skip leading zeros.
LSkipZeroes:
        while (*psz == '0')
            psz++;

        // Get the first digit.
        uT = *psz - '0';
        if (uT > 1)
        {
            // We can skip over this numeric separator character if:
            //  - numeric separators are enabled
            //  - we've walked past at least one zero character (ie: this isn't the first character in psz)
            //  - the previous character was a zero
            //  - the following character is a valid binary digit
            if (*psz == '_' && isNumericSeparatorEnabled && pszSave < psz && psz[-1] == '0' && static_cast<uint>(psz[1] - '0') <= 1)
            {
                psz++;
                goto LSkipZeroes;
            }

            *ppchLim = psz;
            return dbl;
        }

        //Now that leading zeros are skipped first bit should be one so lets
        //go ahead and count it and increment psz
        cbit = 1;
        psz++;

        // According to the existing implementations these numbers
        // should n bits away from 21 and 53. The n bits are determined by the
        // numerical type. for example since 4 bits are necessary to represent a
        // hexadecimal number and 3 bits to represent an octal you will see that
        // the hex case is represented by 21-4 = 17 and the octal case is represented
        // by 21-3 = 18, thus for binary where 1 bit is need to represent 2 numbers 21-1 = 20
        const uint rightShiftValue = 20;
        // Why 52? 52 is the last explicit bit and 1 bit away from 53 (max bits of precision
        // for double precision floating point)
        const uint leftShiftValue = 52;

LGetBinaryDigit:
        uT = *psz - '0';
        if (uT <= 1)
        {
            if (cbit <= rightShiftValue)
            {
                Js::NumberUtilities::LuHiDbl(dbl) |= (uint32)uT << (rightShiftValue - cbit);
            }
            else if (cbit <= leftShiftValue)
            {
                Js::NumberUtilities::LuLoDbl(dbl) |= (uint32)uT << (leftShiftValue - cbit);
            }
            else if (cbit == leftShiftValue + 1)//53 bits
            {
                Js::NumberUtilities::LuLoDbl(dbl) |= (uint32)uT >> (cbit - leftShiftValue);
                bExtra = (byte)(uT << (60 - cbit));
            }
            else if (0 != uT)
            {
                bExtra |= 1;
            }
            cbit++;
            psz++;
            goto LGetBinaryDigit;
        }
        else if (*psz == '_')
        {
            if (isNumericSeparatorEnabled && cbit > 0 && psz[-1] != '_' && static_cast<uint>(psz[1] - '0') <= 1)
            {
                psz++;
                goto LGetBinaryDigit;
            }
        }
        // Set the lim.
        *ppchLim = psz;

        // Set the exponent.
        cbit += 1022;
        if (cbit > 2046)
        {
            // Overflow to Infinity
            Js::NumberUtilities::LuHiDbl(dbl) = 0x7FF00000;
            Js::NumberUtilities::LuLoDbl(dbl) = 0;
            return dbl;
        }

        Js::NumberUtilities::LuHiDbl(dbl) |= (uint32)cbit << 20;

        // Use bExtra to round.
        if ((bExtra & 0x80) && ((bExtra & 0x7F) || (Js::NumberUtilities::LuLoDbl(dbl) & 1)))
        {
            // Round up. Note that this overflows the mantissa correctly,
            // even to Infinity.
            if (0 == ++Js::NumberUtilities::LuLoDbl(dbl))
                ++Js::NumberUtilities::LuHiDbl(dbl);
        }
        return dbl;
    }